

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O0

void * open_backend(void)

{
  void *pvVar1;
  char *pcVar2;
  void *addr;
  char *lib;
  char **be;
  
  lib = (char *)open_backend::backends;
  while( true ) {
    do {
      pcVar2 = lib + 8;
      if (*(long *)lib == 0) {
        return (void *)0x0;
      }
      lib_glob = (void *)dlopen(*(long *)lib,1);
      lib = pcVar2;
    } while (lib_glob == (void *)0x0);
    pvVar1 = (void *)dlsym(lib_glob,"readline");
    if (pvVar1 != (void *)0x0) break;
    dlclose(lib_glob);
  }
  atexit(close_readline);
  return pvVar1;
}

Assistant:

static void *open_backend(void)
{
	static const char * const backends[] = {
		"libreadline.so.7",
		"libeditline.so.0",
		"libreadline.so.6",
		"libreadline.so.5",
		0
	};
	const char * const *be = backends;
	const char *lib;
	
	while ((lib = *be++)) {
		void *addr;
		if (!(lib_glob = dlopen(lib, RTLD_LAZY))) {
			continue;
		}
		addr = dlsym(lib_glob, "readline");
		
		if (addr) {
			atexit(close_readline);
			return addr;
		}
		dlclose(lib_glob);
	}
	return 0;
}